

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall
QCommandLineParserPrivate::registerFoundOption(QCommandLineParserPrivate *this,QString *optionName)

{
  bool bVar1;
  QHash<QString,_long_long> *in_RSI;
  QList<QString> *in_RDI;
  parameter_type in_stack_ffffffffffffffd8;
  
  bVar1 = QHash<QString,_long_long>::contains(in_RSI,(QString *)in_RDI);
  if (bVar1) {
    QList<QString>::append(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    QList<QString>::append(in_RDI,in_stack_ffffffffffffffd8);
  }
  return bVar1;
}

Assistant:

bool QCommandLineParserPrivate::registerFoundOption(const QString &optionName)
{
    if (nameHash.contains(optionName)) {
        optionNames.append(optionName);
        return true;
    } else {
        unknownOptionNames.append(optionName);
        return false;
    }
}